

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O2

bool dg::vr::unsetRelated(Bucket *lt,Type type,Bucket *rt)

{
  bool bVar1;
  uint uVar2;
  iterator __position;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>> *this;
  
  this = (VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)((lt->relatedBuckets)._M_elems + type)
  ;
  if (lt->id != rt->id) {
    uVar2 = dg::vr::Relations::inverted(type);
    __position = VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::find<dg::vr::Bucket>
                           ((VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *)this,rt);
    bVar1 = __position._M_current !=
            (lt->relatedBuckets)._M_elems[type].vec.
            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    if (bVar1) {
      std::
      vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
      ::erase((vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               *)this,(const_iterator)__position._M_current);
      VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
                ((VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)
                 ((rt->relatedBuckets)._M_elems + uVar2),lt);
    }
    return bVar1;
  }
  bVar1 = VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>(this,rt);
  return bVar1;
}

Assistant:

bool unsetRelated(Bucket &lt, Relations::Type type, Bucket &rt) {
        assert(type != Relations::EQ);
        if (lt == rt) {
            return lt.relatedBuckets[type].erase(rt);
        }
        auto &ltRelated = lt.relatedBuckets[type];
        auto &rtRelated = rt.relatedBuckets[Relations::inverted(type)];

        auto found = ltRelated.find(rt);
        if (found == ltRelated.end()) {
            assert(!rtRelated.contains(lt));
            return false;
        }

        ltRelated.erase(found);
        rtRelated.erase(lt);
        return true;
    }